

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void write_gg_palette_file(Config config,char *filename,Image *input_image)

{
  size_t sVar1;
  long lVar2;
  uint16_t c;
  char buf [5];
  ushort local_238;
  char local_235 [5];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  if (config.output_bin == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,".dw",3);
  }
  lVar2 = 10;
  do {
    local_238 = (*(byte *)((long)input_image->palette + lVar2 + -8) & 0xf0) << 4 |
                *(byte *)((long)(input_image->palette + -3) + lVar2) & 0xfff0 |
                (ushort)(*(byte *)((long)input_image->palette + lVar2 + -10) >> 4);
    if (config.output_bin == false) {
      sprintf(local_235,"%04X");
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," $",2);
      sVar1 = strlen(local_235);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_235,sVar1);
    }
    else {
      std::ostream::write((char *)&local_230,(long)&local_238);
    }
    lVar2 = lVar2 + 3;
  } while (lVar2 != 0x3a);
  if (config.output_bin == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void write_gg_palette_file(Config config, const char *filename, Image *input_image) {
    std::ofstream out;
    out.open(filename, config.output_bin ?
        std::ofstream::binary : std::ofstream::out);

    if (!config.output_bin) out << ".dw";

    for (int i = 0; i < MAX_COLOURS; i++) {
        uint16_t c = ((uint16_t) input_image->palette[i].red >> 4)
                   | (uint16_t) (input_image->palette[i].green >> 4) << 4
                   | (uint16_t) (input_image->palette[i].blue >> 4) << 8;

        if (!config.output_bin) {
            char buf[5];
            sprintf(buf, "%04X", c);
            out << " $" << buf;
        } else out.write((const char*)&c, 2);
    }
    if (!config.output_bin) out << "\n";

    out.close();
}